

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

int __thiscall ON_String::CompareOrdinal(ON_String *this,char *other_string,bool bOrdinalIgnoreCase)

{
  int iVar1;
  char *string1;
  bool bOrdinalIgnoreCase_local;
  char *other_string_local;
  ON_String *this_local;
  
  string1 = operator_cast_to_char_(this);
  iVar1 = Length(this);
  iVar1 = CompareOrdinal(string1,iVar1,other_string,-1,bOrdinalIgnoreCase);
  return iVar1;
}

Assistant:

int ON_String::CompareOrdinal(
  const char* other_string,
  bool bOrdinalIgnoreCase
  ) const
{
  return ON_String::CompareOrdinal(
    static_cast< const char* >(*this),
    this->Length(),
    other_string,
    -1,
    bOrdinalIgnoreCase
    );
}